

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fSyncTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::FenceSyncCase::iterate(FenceSyncCase *this)

{
  deUint32 program;
  GLenum GVar1;
  reference pointer;
  size_type sVar2;
  MessageBuilder *pMVar3;
  GLsync p_Var4;
  TestError *this_00;
  int iVar5;
  char (*local_13d8) [8];
  MessageBuilder local_1310;
  undefined4 local_118c;
  MessageBuilder local_1188;
  MessageBuilder local_1008;
  MessageBuilder local_e88;
  MessageBuilder local_d08;
  MessageBuilder local_b88;
  MessageBuilder local_a08;
  MessageBuilder local_888;
  MessageBuilder local_708;
  MessageBuilder local_588;
  GLenum local_404;
  undefined1 local_400 [4];
  GLenum waitValue;
  MessageBuilder local_280;
  ScopedLogSection local_100;
  ScopedLogSection section;
  int local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string header;
  undefined1 local_38 [7];
  bool testOk;
  vector<float,_std::allocator<float>_> vertices;
  TestLog *log;
  FenceSyncCase *this_local;
  
  vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  header.field_2._M_local_buf[0xf] = '\x01';
  local_c4 = this->m_iterNdx + 1;
  de::toString<int>(&local_c0,&local_c4);
  std::operator+(&local_a0,"Case iteration ",&local_c0);
  std::operator+(&local_80,&local_a0," / ");
  de::toString<int>((string *)&section,&NUM_CASE_ITERATIONS);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  tcu::ScopedLogSection::ScopedLogSection
            (&local_100,
             (TestLog *)
             vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(string *)local_60,(string *)local_60);
  glu::CallLogWrapper::enableLogging(&this->super_CallLogWrapper,true);
  program = glu::ShaderProgram::getProgram(this->m_program);
  glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,program);
  glu::CallLogWrapper::glEnable(&this->super_CallLogWrapper,0xb71);
  glu::CallLogWrapper::glClearColor(&this->super_CallLogWrapper,0.3,0.3,0.3,1.0);
  glu::CallLogWrapper::glClearDepthf(&this->super_CallLogWrapper,1.0);
  glu::CallLogWrapper::glClear(&this->super_CallLogWrapper,0x4100);
  glu::CallLogWrapper::glEnableVertexAttribArray(&this->super_CallLogWrapper,0);
  generateVertices((vector<float,_std::allocator<float>_> *)local_38,
                   *(int *)&(this->super_CallLogWrapper).field_0x14,&this->m_rnd);
  pointer = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)local_38,0);
  glu::CallLogWrapper::glVertexAttribPointer(&this->super_CallLogWrapper,0,4,0x1406,'\0',0,pointer);
  sVar2 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_38);
  iVar5 = (int)sVar2;
  if (iVar5 < 0) {
    iVar5 = iVar5 + 3;
  }
  glu::CallLogWrapper::glDrawArrays(&this->super_CallLogWrapper,4,0,iVar5 >> 2);
  tcu::TestLog::operator<<
            (&local_280,
             (TestLog *)
             vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [21])"// Primitives drawn.");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_280);
  p_Var4 = glu::CallLogWrapper::glFenceSync(&this->super_CallLogWrapper,0x9117,0);
  this->m_syncObject = p_Var4;
  GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
  glu::checkError(GVar1,"Sync object created",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                  ,0xcb);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_400,
             (TestLog *)
             vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_400,(char (*) [24])"// Sync object created.");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_400);
  if ((this->m_caseOptions & 1) != 0) {
    glu::CallLogWrapper::glFlush(&this->super_CallLogWrapper);
  }
  if ((this->m_caseOptions & 2) != 0) {
    glu::CallLogWrapper::glFinish(&this->super_CallLogWrapper);
  }
  local_404 = 0;
  if ((this->m_waitCommand & 1) != 0) {
    glu::CallLogWrapper::glWaitSync
              (&this->super_CallLogWrapper,this->m_syncObject,this->m_waitFlags,this->m_timeout);
    GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar1,"glWaitSync called",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xdc);
    tcu::TestLog::operator<<
              (&local_588,
               (TestLog *)
               vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_588,
                        (char (*) [59])"// Wait command glWaitSync called with GL_TIMEOUT_IGNORED.")
    ;
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_588);
  }
  if ((this->m_waitCommand & 2) != 0) {
    local_404 = glu::CallLogWrapper::glClientWaitSync
                          (&this->super_CallLogWrapper,this->m_syncObject,this->m_waitFlags,
                           this->m_timeout);
    GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar1,"glClientWaitSync called",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xe2);
    tcu::TestLog::operator<<
              (&local_708,
               (TestLog *)
               vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_708,(char (*) [34])"// glClientWaitSync return value:");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_708);
    switch(local_404) {
    case 0x911a:
      tcu::TestLog::operator<<
                (&local_888,
                 (TestLog *)
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_888,(char (*) [23])"// GL_ALREADY_SIGNALED");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_888);
      break;
    case 0x911b:
      tcu::TestLog::operator<<
                (&local_a08,
                 (TestLog *)
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_a08,(char (*) [22])"// GL_TIMEOUT_EXPIRED");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_a08);
      break;
    case 0x911c:
      tcu::TestLog::operator<<
                (&local_b88,
                 (TestLog *)
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_b88,(char (*) [26])"// GL_CONDITION_SATISFIED");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_b88);
      break;
    case 0x911d:
      tcu::TestLog::operator<<
                (&local_d08,
                 (TestLog *)
                 vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_d08,(char (*) [18])"// GL_WAIT_FAILED");
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_d08);
      header.field_2._M_local_buf[0xf] = '\0';
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"// Illegal return value!",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                 ,0xea);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  glu::CallLogWrapper::glFinish(&this->super_CallLogWrapper);
  if (((this->m_caseOptions & 2) != 0) && (local_404 != 0x911a)) {
    header.field_2._M_local_buf[0xf] = '\0';
    tcu::TestLog::operator<<
              (&local_e88,
               (TestLog *)
               vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_e88,
                        (char (*) [60])"// Expected glClientWaitSync to return GL_ALREADY_SIGNALED."
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_e88);
  }
  if (this->m_syncObject != (GLsync)0x0) {
    glu::CallLogWrapper::glDeleteSync(&this->super_CallLogWrapper,this->m_syncObject);
    this->m_syncObject = (GLsync)0x0;
    GVar1 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
    glu::checkError(GVar1,"Sync object deleted",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fSyncTests.cpp"
                    ,0xfc);
    tcu::TestLog::operator<<
              (&local_1008,
               (TestLog *)
               vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1008,(char (*) [24])"// Sync object deleted.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1008);
  }
  tcu::TestLog::operator<<
            (&local_1188,
             (TestLog *)
             vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_1188,(char (*) [17])"// Test result: ");
  if ((header.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_13d8 = (char (*) [8])0x2b07628;
  }
  else {
    local_13d8 = (char (*) [8])0x2b9d2df;
  }
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_13d8);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1188);
  if ((header.field_2._M_local_buf[0xf] & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
    this_local._4_4_ = STOP;
  }
  else {
    tcu::TestLog::operator<<
              (&local_1310,
               (TestLog *)
               vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,(BeginMessageToken *)&tcu::TestLog::Message
              );
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1310,
                        (char (*) [50])"// Sync objects created and deleted successfully.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1310);
    iVar5 = this->m_iterNdx + 1;
    this->m_iterNdx = iVar5;
    this_local._4_4_ = (IterateResult)(iVar5 < 5);
  }
  local_118c = 1;
  tcu::ScopedLogSection::~ScopedLogSection(&local_100);
  std::__cxx11::string::~string((string *)local_60);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  return this_local._4_4_;
}

Assistant:

FenceSyncCase::IterateResult FenceSyncCase::iterate (void)
{
	TestLog&					log			= m_testCtx.getLog();
	std::vector<float>			vertices;
	bool						testOk		= true;

	std::string					header		= "Case iteration " + de::toString(m_iterNdx+1) + " / " + de::toString(NUM_CASE_ITERATIONS);
	const tcu::ScopedLogSection	section		(log, header, header);

	enableLogging(true);

	DE_ASSERT		(m_program);
	glUseProgram	(m_program->getProgram());
	glEnable		(GL_DEPTH_TEST);
	glClearColor	(0.3f, 0.3f, 0.3f, 1.0f);
	glClearDepthf	(1.0f);
	glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

	// Generate vertices

	glEnableVertexAttribArray (0);
	generateVertices		  (vertices, m_numPrimitives, m_rnd);
	glVertexAttribPointer	  (0, 4, GL_FLOAT, GL_FALSE, 0, &vertices[0]);

	// Draw

	glDrawArrays(GL_TRIANGLES, 0, (int)vertices.size() / 4);
	log << TestLog::Message << "// Primitives drawn." << TestLog::EndMessage;

	// Create sync object

	m_syncObject = glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLU_CHECK_MSG ("Sync object created");
	log << TestLog::Message << "// Sync object created." << TestLog::EndMessage;

	if (m_caseOptions & CASE_FLUSH_BEFORE_WAIT)
		glFlush();
	if (m_caseOptions & CASE_FINISH_BEFORE_WAIT)
		glFinish();

	// Wait for sync object

	GLenum waitValue = 0;

	if (m_waitCommand & COMMAND_WAIT_SYNC)
	{
		DE_ASSERT(m_timeout == GL_TIMEOUT_IGNORED);
		DE_ASSERT(m_waitFlags == 0);
		glWaitSync(m_syncObject, m_waitFlags, m_timeout);
		GLU_CHECK_MSG ("glWaitSync called");
		log << TestLog::Message << "// Wait command glWaitSync called with GL_TIMEOUT_IGNORED." << TestLog::EndMessage;
	}
	if (m_waitCommand & COMMAND_CLIENT_WAIT_SYNC)
	{
		waitValue = glClientWaitSync(m_syncObject, m_waitFlags, m_timeout);
		GLU_CHECK_MSG ("glClientWaitSync called");
		log << TestLog::Message << "// glClientWaitSync return value:" << TestLog::EndMessage;
		switch (waitValue)
		{
			case GL_ALREADY_SIGNALED:	 log << TestLog::Message << "// GL_ALREADY_SIGNALED"	<< TestLog::EndMessage; break;
			case GL_TIMEOUT_EXPIRED:	 log << TestLog::Message << "// GL_TIMEOUT_EXPIRED"		<< TestLog::EndMessage; break;
			case GL_CONDITION_SATISFIED: log << TestLog::Message << "// GL_CONDITION_SATISFIED"	<< TestLog::EndMessage; break;
			case GL_WAIT_FAILED:		 log << TestLog::Message << "// GL_WAIT_FAILED"			<< TestLog::EndMessage; testOk = false; break;
			default:					 TCU_FAIL("// Illegal return value!");
		}
	}

	glFinish();

	if (m_caseOptions & CASE_FINISH_BEFORE_WAIT && waitValue != GL_ALREADY_SIGNALED)
	{
		testOk = false;
		log << TestLog::Message << "// Expected glClientWaitSync to return GL_ALREADY_SIGNALED." << TestLog::EndMessage;
	}

	// Delete sync object

	if (m_syncObject)
	{
		glDeleteSync(m_syncObject);
		m_syncObject = DE_NULL;
		GLU_CHECK_MSG ("Sync object deleted");
		log << TestLog::Message << "// Sync object deleted." << TestLog::EndMessage;
	}

	// Evaluate test result

	log << TestLog::Message << "// Test result: " << (testOk ? "Passed!" : "Failed!") << TestLog::EndMessage;

	if (!testOk)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << TestLog::Message << "// Sync objects created and deleted successfully." << TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}